

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QRect>::erase(QMovableArrayOps<QRect> *this,QRect *b,qsizetype n)

{
  QRect *__src;
  QArrayDataPointer<QRect> *pQVar1;
  QRect *pQVar2;
  long in_RDX;
  QArrayDataPointer<QRect> *in_RSI;
  long in_RDI;
  QRect *e;
  QRect *in_stack_ffffffffffffffa8;
  QArrayDataPointer<QRect> *in_stack_ffffffffffffffb0;
  
  __src = (QRect *)(&in_RSI->d + in_RDX * 2);
  std::destroy<QRect*>((QRect *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  pQVar1 = (QArrayDataPointer<QRect> *)
           QArrayDataPointer<QRect>::begin((QArrayDataPointer<QRect> *)0x6215da);
  if ((in_RSI == pQVar1) &&
     (pQVar2 = QArrayDataPointer<QRect>::end(in_stack_ffffffffffffffb0), __src != pQVar2)) {
    *(QRect **)(in_RDI + 8) = __src;
  }
  else {
    pQVar2 = QArrayDataPointer<QRect>::end(in_stack_ffffffffffffffb0);
    if (__src != pQVar2) {
      pQVar2 = QArrayDataPointer<QRect>::end(in_RSI);
      memmove(in_RSI,__src,((long)pQVar2 - (long)__src >> 4) << 4);
    }
  }
  *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) - in_RDX;
  return;
}

Assistant:

void erase(T *b, qsizetype n)
    {
        T *e = b + n;

        Q_ASSERT(this->isMutable());
        Q_ASSERT(b < e);
        Q_ASSERT(b >= this->begin() && b < this->end());
        Q_ASSERT(e > this->begin() && e <= this->end());

        // Comply with std::vector::erase(): erased elements and all after them
        // are invalidated. However, erasing from the beginning effectively
        // means that all iterators are invalidated. We can use this freedom to
        // erase by moving towards the end.

        std::destroy(b, e);
        if (b == this->begin() && e != this->end()) {
            this->ptr = e;
        } else if (e != this->end()) {
            memmove(static_cast<void *>(b), static_cast<const void *>(e), (static_cast<const T *>(this->end()) - e)*sizeof(T));
        }
        this->size -= n;
    }